

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

void __thiscall
AbstractTransaction_GetLockTime_Test::TestBody(AbstractTransaction_GetLockTime_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_88;
  Message local_80;
  int local_78 [5];
  uint32_t local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  Transaction tx;
  AbstractTransaction_GetLockTime_Test *this_local;
  
  cfd::core::Transaction::Transaction((Transaction *)&gtest_ar.message_,2,3);
  local_64 = cfd::core::AbstractTransaction::GetLockTime((AbstractTransaction *)&gtest_ar.message_);
  local_78[0] = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_60,"tx.GetLockTime()","3",&local_64,local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x5d,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  cfd::core::Transaction::~Transaction((Transaction *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(AbstractTransaction, GetLockTime) {
  Transaction tx(2, 3);
  EXPECT_EQ(tx.GetLockTime(), 3);
}